

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  qsizetype qVar3;
  long lVar4;
  QDnsCachedName *pQVar5;
  long lVar6;
  Int IVar7;
  long lVar8;
  QDnsCachedName *pQVar9;
  QDnsCachedName *pQVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (((pQVar1 == (QArrayData *)0x0 || where != GrowsAtEnd) || (n < 1)) ||
     (1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i)) {
    if (pQVar1 == (QArrayData *)0x0) {
      qVar3 = 0;
    }
    else {
      qVar3 = pQVar1->alloc;
    }
    if (qVar3 < this->size) {
      qVar3 = this->size;
    }
    if (where == GrowsAtEnd) {
      lVar4 = freeSpaceAtEnd(this);
    }
    else {
      lVar4 = freeSpaceAtBegin(this);
    }
    lVar4 = (qVar3 + n) - lVar4;
    if (pQVar1 == (QArrayData *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = pQVar1->alloc;
      lVar8 = lVar4;
      if (lVar4 < lVar6) {
        lVar8 = lVar6;
      }
      if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar4 = lVar8;
      }
    }
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = (QDnsCachedName *)
             QArrayData::allocate((QArrayData **)&local_58,0x20,0x10,lVar4,(uint)(lVar4 <= lVar6));
    pDVar2 = local_58.d;
    if (pQVar5 != (QDnsCachedName *)0x0 && local_58.d != (Data *)0x0) {
      if (where == GrowsAtBeginning) {
        lVar6 = (((local_58.d)->super_QArrayData).alloc - (this->size + n)) / 2;
        lVar4 = 0;
        if (0 < lVar6) {
          lVar4 = lVar6;
        }
        lVar4 = lVar4 + n;
      }
      else {
        lVar4 = freeSpaceAtBegin(this);
      }
      if (this->d == (Data *)0x0) {
        IVar7 = 0;
      }
      else {
        IVar7 = (this->d->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
      pQVar5 = pQVar5 + lVar4;
      (pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar7;
    }
    local_58.size = 0;
    lVar4 = this->size;
    if (lVar4 == 0) {
      local_58.size = 0;
    }
    else {
      local_58.d = pDVar2;
      local_58.ptr = pQVar5;
      if ((this->d == (Data *)0x0) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pQVar10 = this->ptr;
        pQVar9 = pQVar10 + lVar4;
        for (; qVar3 = local_58.size, pQVar10 < pQVar9; pQVar10 = pQVar10 + 1) {
          QArrayDataPointer<char16_t>::QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(pQVar5 + local_58.size),
                     (QArrayDataPointer<char16_t> *)pQVar10);
          pQVar5[qVar3].code = pQVar10->code;
          local_58.size = local_58.size + 1;
        }
      }
      else {
        pQVar10 = this->ptr;
        pQVar9 = pQVar10 + lVar4;
        for (; pQVar10 < pQVar9; pQVar10 = pQVar10 + 1) {
          anon_unknown.dwarf_987ab8::QDnsCachedName::QDnsCachedName(pQVar5 + local_58.size,pQVar10);
          local_58.size = local_58.size + 1;
        }
      }
    }
    local_58.d = this->d;
    local_58.ptr = this->ptr;
    this->d = pDVar2;
    this->ptr = pQVar5;
    qVar3 = this->size;
    this->size = local_58.size;
    local_58.size = qVar3;
    ~QArrayDataPointer(&local_58);
  }
  else {
    lVar4 = pQVar1->alloc;
    qVar3 = freeSpaceAtEnd(this);
    auVar11 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x20,(lVar4 - qVar3) + 1,Grow);
    this->d = (Data *)auVar11._0_8_;
    this->ptr = (QDnsCachedName *)auVar11._8_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }